

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

void __thiscall RtMidiOut::openMidiApi(RtMidiOut *this,Api api,string *clientName)

{
  MidiApi *pMVar1;
  
  pMVar1 = (this->super_RtMidi).rtapi_;
  if (pMVar1 != (MidiApi *)0x0) {
    (*pMVar1->_vptr_MidiApi[1])();
  }
  (this->super_RtMidi).rtapi_ = (MidiApi *)0x0;
  if (api == LINUX_ALSA) {
    pMVar1 = (MidiApi *)operator_new(0x50);
    MidiOutAlsa::MidiOutAlsa((MidiOutAlsa *)pMVar1,clientName);
    (this->super_RtMidi).rtapi_ = pMVar1;
  }
  return;
}

Assistant:

void RtMidiOut :: openMidiApi( RtMidi::Api api, const std::string &clientName )
{
  delete rtapi_;
  rtapi_ = 0;

#if defined(__UNIX_JACK__)
  if ( api == UNIX_JACK )
    rtapi_ = new MidiOutJack( clientName );
#endif
#if defined(__LINUX_ALSA__)
  if ( api == LINUX_ALSA )
    rtapi_ = new MidiOutAlsa( clientName );
#endif
#if defined(__WINDOWS_MM__)
  if ( api == WINDOWS_MM )
    rtapi_ = new MidiOutWinMM( clientName );
#endif
#if defined(__MACOSX_CORE__)
  if ( api == MACOSX_CORE )
    rtapi_ = new MidiOutCore( clientName );
#endif
#if defined(__RTMIDI_DUMMY__)
  if ( api == RTMIDI_DUMMY )
    rtapi_ = new MidiOutDummy( clientName );
#endif
}